

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall
Centaurus::NFABaseState<unsigned_char,_int>::rebase_transitions
          (NFABaseState<unsigned_char,_int> *this,NFABaseState<unsigned_char,_int> *src,
          int offset_value)

{
  bool bVar1;
  int iVar2;
  pointer pNVar3;
  pointer pNVar4;
  value_type local_68;
  
  pNVar4 = (src->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (src->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar4 != pNVar3) {
    do {
      iVar2 = pNVar4->m_dest;
      bVar1 = pNVar4->m_long;
      local_68._vptr_NFATransition = (_func_int **)&PTR__NFATransition_0019ae30;
      local_68.m_label._vptr_CharClass = (_func_int **)&PTR__CharClass_0019a4d8;
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      vector(&local_68.m_label.m_ranges,&(pNVar4->m_label).m_ranges);
      local_68.m_tag = 0;
      local_68.m_dest = iVar2 + offset_value;
      local_68.m_long = bVar1;
      std::
      vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ::push_back(&this->m_transitions,&local_68);
      local_68._vptr_NFATransition = (_func_int **)&PTR__NFATransition_0019ae30;
      local_68.m_label._vptr_CharClass = (_func_int **)&PTR__CharClass_0019a4d8;
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      ~vector(&local_68.m_label.m_ranges);
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != pNVar3);
  }
  return;
}

Assistant:

void rebase_transitions(const NFABaseState<TCHAR, TLABEL>& src, int offset_value)
    {
        for (const auto& i : src.m_transitions)
        {
            add_transition(i.offset(offset_value));
        }
    }